

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

lgx_symbol_t * lgx_symbol_get(lgx_ast_node_t *node,lgx_str_t *name,uint offset)

{
  lgx_ht_node_t *plVar1;
  lgx_symbol_t *n;
  lgx_ht_node_t *ht_node;
  uint offset_local;
  lgx_str_t *name_local;
  lgx_ast_node_t *node_local;
  
  if (((*(char *)node != '\x01') ||
      (plVar1 = lgx_ht_get((node->u).symbols,name), plVar1 == (lgx_ht_node_t *)0x0)) ||
     (((node_local = (lgx_ast_node_t *)plVar1->v, node->parent != (lgx_ast_node_s *)0x0 ||
       ((*(int *)node_local != 2 || (*(int *)&node_local->parent != 0xb)))) &&
      (offset < (node_local[1].parent)->offset)))) {
    if (node->parent == (lgx_ast_node_s *)0x0) {
      node_local = (lgx_ast_node_t *)0x0;
    }
    else {
      node_local = (lgx_ast_node_t *)lgx_symbol_get(node->parent,name,offset);
    }
  }
  return (lgx_symbol_t *)node_local;
}

Assistant:

lgx_symbol_t* lgx_symbol_get(lgx_ast_node_t* node, lgx_str_t* name, unsigned offset) {
    if (node->type == BLOCK_STATEMENT) {
        lgx_ht_node_t* ht_node = lgx_ht_get(node->u.symbols, name);
        if (ht_node) {
            lgx_symbol_t* n = (lgx_symbol_t*)ht_node->v;
            // 全局函数不需要遵循先声明后使用的原则
            if ((node->parent == NULL && n->s_type == S_CONSTANT && n->type.type == T_FUNCTION) ||
                n->node->offset <= offset) {
                return n;
            }
        }
    }

    if (!node->parent) {
        return NULL;
    }

    return lgx_symbol_get(node->parent, name, offset);
}